

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extended_data_dictionary_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
ExtendedDataDictionaryTest_TestNextFreeFidForAOneEntryDataDictionaryIsOneMoreThanTheLargestExistingFid_Test
::TestBody(ExtendedDataDictionaryTest_TestNextFreeFidForAOneEntryDataDictionaryIsOneMoreThanTheLargestExistingFid_Test
           *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  ExtendableDataDictionary dataDictionary;
  Message local_d0;
  AssertHelper local_c8;
  internal local_c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  FieldDef local_b0 [8];
  long *local_a8;
  long local_98 [3];
  code *local_80;
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  local_78;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  _Stack_48;
  
  local_80 = bidfx_public_api::tools::ByteBuffer::WriteShort;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left =
       &_Stack_48._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  _Stack_48._M_impl._0_8_ = 0;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  _Stack_48._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  _Stack_48._M_impl.super__Rb_tree_header._M_header._M_right =
       _Stack_48._M_impl.super__Rb_tree_header._M_header._M_left;
  bidfx_public_api::price::pixie::FieldDef::FieldDef(local_b0,(FieldDef *)&ask2);
  bidfx_public_api::price::pixie::ExtendableDataDictionary::AddFieldDef(&local_80,local_b0);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  local_d0.ss_.ptr_._0_4_ = ask2 + 1;
  local_c8.data_._0_4_ = bidfx_public_api::price::pixie::ExtendableDataDictionary::NextFreeFid();
  testing::internal::CmpHelperEQ<int,int>
            (local_c0,"ask2.fid_ + 1","dataDictionary.NextFreeFid()",(int *)&local_d0,
             (int *)&local_c8);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message(&local_d0);
    if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/extended_data_dictionary_test.cpp"
               ,0xb3,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (CONCAT44(local_d0.ss_.ptr_._4_4_,(int)local_d0.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_d0.ss_.ptr_._4_4_,(int)local_d0.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d0.ss_.ptr_._4_4_,(int)local_d0.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_80 = bidfx_public_api::tools::ByteBuffer::WriteShort;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree(&_Stack_48);
  std::
  _Rb_tree<int,_std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>,_std::_Select1st<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bidfx_public_api::price::pixie::FieldDef>_>_>
  ::~_Rb_tree(&local_78);
  return;
}

Assistant:

ExtendableDataDictionary CreateExtendableDataDictionary()
{
    ExtendableDataDictionary result = ExtendableDataDictionary();
    result.AddFieldDef(bid2);
    result.AddFieldDef(ask2);
    result.AddFieldDef(bid_size2);
    result.AddFieldDef(ask_size2);
    result.AddFieldDef(status2);
    return result;
}